

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

int Abc_TtCountOnesInCofsFast6_rec(word Truth,int iVar,int nBytes,int *pStore)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  
  if (Truth == 0) {
    iVar1 = 0;
  }
  else if (Truth == 0xffffffffffffffff) {
    if (-1 < iVar) {
      uVar4 = 0;
      do {
        pStore[uVar4] = pStore[uVar4] + nBytes * 4;
        uVar4 = uVar4 + 1;
      } while (iVar + 1 != uVar4);
    }
    iVar1 = nBytes << 3;
  }
  else if (nBytes == 1) {
    if (iVar != 2) {
      __assert_fail("iVar == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauCanon.c"
                    ,0x19b,"int Abc_TtCountOnesInCofsFast6_rec(word, int, int, int *)");
    }
    uVar5 = (uint)Truth;
    *pStore = *pStore + Abc_TtCountOnesInCofsFast6_rec::bit_count[uVar5 & 0x55];
    pStore[1] = pStore[1] + Abc_TtCountOnesInCofsFast6_rec::bit_count[uVar5 & 0x33];
    pStore[2] = pStore[2] + Abc_TtCountOnesInCofsFast6_rec::bit_count[uVar5 & 0xf];
    iVar1 = Abc_TtCountOnesInCofsFast6_rec::bit_count[Truth & 0xff];
  }
  else {
    if (5 < (uint)iVar) {
      __assert_fail("iVar >= 0 && iVar < 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                    ,0x1bb,"word Abc_Tt6Cofactor0(word, int)");
    }
    bVar3 = (byte)(1 << ((byte)iVar & 0x1f));
    iVar2 = Abc_TtCountOnesInCofsFast6_rec
                      ((s_Truths6Neg[(uint)iVar] & Truth) << (bVar3 & 0x3f) |
                       s_Truths6Neg[(uint)iVar] & Truth,iVar + -1,nBytes / 2,pStore);
    iVar1 = Abc_TtCountOnesInCofsFast6_rec
                      ((Truth & s_Truths6[(uint)iVar]) >> (bVar3 & 0x3f) |
                       Truth & s_Truths6[(uint)iVar],iVar + -1,nBytes / 2,pStore);
    pStore[(uint)iVar] = pStore[(uint)iVar] + iVar2;
    iVar1 = iVar1 + iVar2;
  }
  return iVar1;
}

Assistant:

int Abc_TtCountOnesInCofsFast6_rec( word Truth, int iVar, int nBytes, int * pStore )
{
    static int bit_count[256] = {
      0,1,1,2,1,2,2,3,1,2,2,3,2,3,3,4,1,2,2,3,2,3,3,4,2,3,3,4,3,4,4,5,
      1,2,2,3,2,3,3,4,2,3,3,4,3,4,4,5,2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,
      1,2,2,3,2,3,3,4,2,3,3,4,3,4,4,5,2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,
      2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,3,4,4,5,4,5,5,6,4,5,5,6,5,6,6,7,
      1,2,2,3,2,3,3,4,2,3,3,4,3,4,4,5,2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,
      2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,3,4,4,5,4,5,5,6,4,5,5,6,5,6,6,7,
      2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,3,4,4,5,4,5,5,6,4,5,5,6,5,6,6,7,
      3,4,4,5,4,5,5,6,4,5,5,6,5,6,6,7,4,5,5,6,5,6,6,7,5,6,6,7,6,7,7,8
    };
    int nMints0, nMints1;
    if ( Truth == 0 )
        return 0;
    if ( ~Truth == 0 )
    {
        int i;
        for ( i = 0; i <= iVar; i++ )
            pStore[i] += nBytes * 4;
        return nBytes * 8;
    }
    if ( nBytes == 1 )
    {
        assert( iVar == 2 );
        pStore[0] += bit_count[ Truth & 0x55 ];
        pStore[1] += bit_count[ Truth & 0x33 ];
        pStore[2] += bit_count[ Truth & 0x0F ];
        return bit_count[ Truth & 0xFF ];
    }
    nMints0 = Abc_TtCountOnesInCofsFast6_rec( Abc_Tt6Cofactor0(Truth, iVar), iVar - 1, nBytes/2, pStore );
    nMints1 = Abc_TtCountOnesInCofsFast6_rec( Abc_Tt6Cofactor1(Truth, iVar), iVar - 1, nBytes/2, pStore );
    pStore[iVar] += nMints0;
    return nMints0 + nMints1;
}